

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListIteratorTest_begin_end_backward_Test::TestBody
          (IntrusiveListIteratorTest_begin_end_backward_Test *this)

{
  TestObjectList *pTVar1;
  TestObject *pTVar2;
  IntrusiveListIteratorTest *this_00;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  pointer pTVar6;
  int line;
  long lVar7;
  int *lhs;
  char *message;
  vector<int,_std::allocator<int>_> *in_R9;
  TestObject *pTVar8;
  unsigned_long uVar9;
  iterator rhs;
  const_iterator first;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertionResult gtest_ar;
  _Vector_base<int,_std::allocator<int>_> local_98;
  IntrusiveListIteratorTest_begin_end_backward_Test *local_78;
  AssertHelper local_70;
  unsigned_long local_68;
  iterator local_60;
  iterator local_50;
  undefined8 local_3c;
  undefined4 local_34;
  
  pTVar1 = &(this->super_IntrusiveListIteratorTest).list_;
  pTVar2 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_3c = 0x200000003;
  local_34 = 1;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = this;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_98,&local_3c);
  lVar7 = 0;
  pTVar8 = (TestObject *)0x0;
  uVar9 = 0;
  local_60.list_ = pTVar1;
  local_50.list_ = pTVar1;
  local_50.node_ = pTVar2;
  do {
    rhs.node_ = pTVar8;
    rhs.list_ = pTVar1;
    local_68 = uVar9;
    bVar5 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator::operator!=
                      (&local_50,rhs);
    if (!bVar5) {
      local_b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_98._M_impl.super__Vector_impl_data._M_finish -
            (long)local_98._M_impl.super__Vector_impl_data._M_start >> 2);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"count","expected.size()",&local_68,
                 (unsigned_long *)&local_b0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        line = 0xb1;
LAB_001fa088:
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                   ,line,message);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_b0);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
      this_00 = (IntrusiveListIteratorTest *)(local_78->super_IntrusiveListIteratorTest).clist_;
      piVar3 = (intrusive_list<(anonymous_namespace)::TestObject> *)
               (this_00->super_IntrusiveListTest).super_Test._vptr_Test;
      local_50.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)0x200000003;
      local_50.node_ = (TestObject *)CONCAT44(local_50.node_._4_4_,1);
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
                ((vector<int,std::allocator<int>> *)&local_98,&local_50);
      first.node_ = (TestObject *)this_00;
      first.list_ = piVar3;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (vector<int,std::allocator<int>> *)&local_98;
      anon_unknown.dwarf_6462d::IntrusiveListIteratorTest::
      TestBackward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                (this_00,first,(const_iterator)(auVar4 << 0x40),in_R9);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
      return;
    }
    if (pTVar8 == (TestObject *)0x0) {
      pTVar8 = (TestObject *)pTVar1;
    }
    pTVar8 = (pTVar8->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
    lhs = (int *)((long)local_98._M_impl.super__Vector_impl_data._M_start + lVar7);
    local_60.node_ = pTVar8;
    pTVar6 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator::operator->
                       (&local_60);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"expected[count]","last->data",lhs,&pTVar6->data);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_b0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0xae;
      goto LAB_001fa088;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 4;
  } while( true );
}

Assistant:

TEST_F(IntrusiveListIteratorTest, begin_end_backward) {
  TestBackward(list_.begin(), list_.end(), {3, 2, 1});
  TestBackward(clist_.begin(), clist_.end(), {3, 2, 1});
}